

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdcTable.c
# Opt level: O3

void Bdc_TableAdd(Bdc_Man_t *p,Bdc_Fun_t *pFunc)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  Vec_Int_t *pVVar4;
  int *piVar5;
  Bdc_Fun_t **ppBVar6;
  Bdc_Fun_t *pBVar7;
  ulong uVar8;
  
  ppBVar6 = p->pTable;
  uVar1 = pFunc->uSupp;
  uVar8 = (ulong)uVar1;
  pBVar7 = ppBVar6[uVar8];
  if (pBVar7 == (Bdc_Fun_t *)0x0) {
    pVVar4 = p->vSpots;
    uVar2 = pVVar4->nSize;
    if (uVar2 == pVVar4->nCap) {
      if ((int)uVar2 < 0x10) {
        if (pVVar4->pArray == (int *)0x0) {
          piVar5 = (int *)malloc(0x40);
        }
        else {
          piVar5 = (int *)realloc(pVVar4->pArray,0x40);
        }
        pVVar4->pArray = piVar5;
        if (piVar5 == (int *)0x0) {
LAB_005ccfd4:
          __assert_fail("p->pArray",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
        }
        pVVar4->nCap = 0x10;
      }
      else {
        if (pVVar4->pArray == (int *)0x0) {
          piVar5 = (int *)malloc((ulong)uVar2 * 8);
        }
        else {
          piVar5 = (int *)realloc(pVVar4->pArray,(ulong)uVar2 * 8);
        }
        pVVar4->pArray = piVar5;
        if (piVar5 == (int *)0x0) goto LAB_005ccfd4;
        pVVar4->nCap = uVar2 * 2;
      }
    }
    else {
      piVar5 = pVVar4->pArray;
    }
    iVar3 = pVVar4->nSize;
    pVVar4->nSize = iVar3 + 1;
    piVar5[iVar3] = uVar1;
    ppBVar6 = p->pTable;
    uVar8 = (ulong)pFunc->uSupp;
    pBVar7 = ppBVar6[uVar8];
  }
  pFunc->pNext = pBVar7;
  ppBVar6[uVar8] = pFunc;
  return;
}

Assistant:

void Bdc_TableAdd( Bdc_Man_t * p, Bdc_Fun_t * pFunc )
{
    if ( p->pTable[pFunc->uSupp] == NULL )
        Vec_IntPush( p->vSpots, pFunc->uSupp );
    pFunc->pNext = p->pTable[pFunc->uSupp];
    p->pTable[pFunc->uSupp] = pFunc;
}